

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::GetNameEqNumToken
          (Token *__return_storage_ptr__,WastLexer *this,string_view name,TokenType token_type)

{
  char cVar1;
  bool bVar2;
  ReservedChars RVar3;
  long lVar4;
  size_t offset;
  byte *pbVar5;
  byte *pbVar6;
  size_t sVar7;
  byte *pbVar8;
  uint uVar9;
  
  offset = name._M_len;
  pbVar8 = (byte *)this->cursor_;
  pbVar6 = pbVar8;
  if (offset != 0) {
    sVar7 = 0;
    pbVar5 = pbVar8;
    do {
      cVar1 = name._M_str[sVar7];
      uVar9 = 0xffffffff;
      pbVar6 = pbVar5;
      if (pbVar5 < this->buffer_end_) {
        pbVar6 = pbVar5 + 1;
        this->cursor_ = (char *)pbVar6;
        uVar9 = (uint)*pbVar5;
      }
      if (uVar9 != (int)cVar1) {
        this->cursor_ = (char *)pbVar8;
        goto LAB_00152edf;
      }
      sVar7 = sVar7 + 1;
      pbVar5 = pbVar6;
    } while (offset != sVar7);
  }
  lVar4 = 0;
  pbVar8 = pbVar6;
  while( true ) {
    uVar9 = 0xffffffff;
    pbVar5 = pbVar8;
    if (pbVar8 < this->buffer_end_) {
      pbVar5 = pbVar8 + 1;
      this->cursor_ = (char *)pbVar5;
      uVar9 = (uint)*pbVar8;
    }
    if (uVar9 != (int)":0x"[lVar4 + 1]) break;
    lVar4 = lVar4 + 1;
    pbVar8 = pbVar5;
    if (lVar4 == 2) {
      bVar2 = ReadHexNum(this);
LAB_00152eb9:
      if ((bVar2 == false) || (RVar3 = ReadReservedChars(this), RVar3 != None)) {
LAB_00152edf:
        GetKeywordToken(__return_storage_ptr__,this);
      }
      else {
        TextToken(__return_storage_ptr__,this,token_type,offset);
      }
      return __return_storage_ptr__;
    }
  }
  this->cursor_ = (char *)pbVar6;
  bVar2 = ReadNum(this);
  goto LAB_00152eb9;
}

Assistant:

Token WastLexer::GetNameEqNumToken(std::string_view name,
                                   TokenType token_type) {
  if (MatchString(name)) {
    if (MatchString("0x")) {
      if (ReadHexNum() && NoTrailingReservedChars()) {
        return TextToken(token_type, name.size());
      }
    } else if (ReadNum() && NoTrailingReservedChars()) {
      return TextToken(token_type, name.size());
    }
  }
  return GetKeywordToken();
}